

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O2

void Imf_3_2::
     GetChannelsInMultiPartFile<std::vector<Imf_3_2::MultiViewChannelName,std::allocator<Imf_3_2::MultiViewChannelName>>>
               (MultiPartInputFile *file,
               vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
               *chans)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  Header *pHVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  ConstIterator tmp;
  StringVector mview;
  MultiViewChannelName m;
  string view;
  allocator<char> local_101;
  MultiPartInputFile *local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_> *local_e0;
  undefined1 local_d8 [32];
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  int local_98;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70 [32];
  string local_50 [32];
  
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = file;
  local_e0 = chans;
  iVar3 = Imf_3_2::MultiPartInputFile::parts();
  bVar1 = false;
  if (iVar3 == 1) {
    pHVar5 = (Header *)Imf_3_2::MultiPartInputFile::header((int)local_100);
    cVar2 = Imf_3_2::hasMultiView(pHVar5);
    if (cVar2 == '\0') {
      bVar1 = false;
    }
    else {
      pHVar5 = (Header *)Imf_3_2::MultiPartInputFile::header((int)local_100);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)Imf_3_2::multiView_abi_cxx11_(pHVar5);
      bVar1 = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_f8,__x);
    }
  }
  iVar3 = 0;
  while( true ) {
    iVar4 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar4 <= iVar3) break;
    Imf_3_2::MultiPartInputFile::header((int)local_100);
    Imf_3_2::Header::channels();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"",(allocator<char> *)local_d8);
    Imf_3_2::MultiPartInputFile::header((int)local_100);
    cVar2 = Imf_3_2::Header::hasView();
    if (cVar2 != '\0') {
      Imf_3_2::MultiPartInputFile::header((int)local_100);
      Imf_3_2::Header::view_abi_cxx11_();
      std::__cxx11::string::_M_assign(local_70);
    }
    p_Var6 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    while( true ) {
      p_Var7 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
      if (p_Var6 == p_Var7) break;
      local_d8._0_8_ = local_d8 + 0x10;
      local_d8._8_8_ = 0;
      local_d8[0x10] = '\0';
      local_b8._M_p = (pointer)&local_a8;
      local_b0 = 0;
      local_a8._M_local_buf[0] = '\0';
      local_90._M_p = (pointer)&local_80;
      local_88 = 0;
      local_80._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>(local_50,(char *)(p_Var6 + 1),&local_101);
      std::__cxx11::string::operator=((string *)local_d8,local_50);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::_M_assign((string *)&local_90);
      if (bVar1) {
        Imf_3_2::viewFromChannelName(local_50,(vector *)local_d8);
        std::__cxx11::string::operator=((string *)&local_b8,local_50);
        std::__cxx11::string::~string(local_50);
        Imf_3_2::removeViewName(local_50,(string *)&local_90);
        std::__cxx11::string::operator=((string *)local_d8,local_50);
        std::__cxx11::string::~string(local_50);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_b8);
      }
      local_98 = iVar3;
      std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
      push_back(local_e0,(MultiViewChannelName *)local_d8);
      MultiViewChannelName::~MultiViewChannelName((MultiViewChannelName *)local_d8);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    }
    std::__cxx11::string::~string(local_70);
    iVar3 = iVar3 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  return;
}

Assistant:

inline void
GetChannelsInMultiPartFile (const MultiPartInputFile& file, T& chans)
{
    bool         has_multiview = false;
    StringVector mview;
    if (file.parts () == 1)
    {
        if (hasMultiView (file.header (0)))
        {
            mview         = multiView (file.header (0));
            has_multiview = true;
        }
    }

    for (int p = 0; p < file.parts (); p++)
    {
        const ChannelList& c = file.header (p).channels ();

        std::string view = "";
        if (file.header (p).hasView ()) { view = file.header (p).view (); }
        for (ChannelList::ConstIterator i = c.begin (); i != c.end (); i++)
        {
            MultiViewChannelName m;
            m.name          = std::string (i.name ());
            m.internal_name = m.name;

            if (has_multiview)
            {
                m.view = viewFromChannelName (m.name, mview);
                m.name = removeViewName (m.internal_name, m.view);
            }
            else
            {
                m.view = view;
            }
            m.part_number = p;
            chans.push_back (m);
        }
    }
}